

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O0

void confidence_print_result(int f,float res,float confidence,v_array<char> tag)

{
  v_array<char> tag_00;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  int in_EDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  void *in_stack_00000008;
  undefined8 in_stack_00000010;
  ssize_t t;
  ssize_t len;
  char temp [30];
  stringstream ss;
  int f_00;
  stringstream *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffda0;
  string *this;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  string local_238 [32];
  ssize_t local_218;
  string local_210 [32];
  long local_1f0;
  char local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188;
  float local_c;
  float local_8;
  
  if (-1 < in_EDI) {
    local_c = in_XMM1_Da;
    local_8 = in_XMM0_Da;
    std::__cxx11::stringstream::stringstream(local_198);
    pcVar6 = local_1b8;
    sprintf(pcVar6,"%f %f",SUB84((double)local_8,0),SUB84((double)local_c,0));
    std::operator<<(&local_188,pcVar6);
    tag_00._end = (char *)in_stack_fffffffffffffda8;
    tag_00._begin = (char *)in_stack_fffffffffffffda0;
    tag_00.end_array._0_4_ = in_stack_fffffffffffffdb0;
    tag_00.end_array._4_4_ = in_stack_fffffffffffffdb4;
    tag_00.erase_count = (size_t)pcVar6;
    f_00 = in_stack_00000010._4_4_;
    iVar1 = print_tag(in_stack_fffffffffffffd90,tag_00);
    if (iVar1 == 0) {
      std::operator<<(&local_188,' ');
    }
    std::operator<<(&local_188,'\n');
    std::__cxx11::stringstream::str();
    this = local_210;
    lVar2 = std::__cxx11::string::size();
    std::__cxx11::string::~string(this);
    local_1f0 = lVar2;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sVar3 = io_buf::write_file_or_socket(f_00,in_stack_00000008,0x282329);
    std::__cxx11::string::~string(local_238);
    local_218 = sVar3;
    if (sVar3 != local_1f0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return;
}

Assistant:

void confidence_print_result(int f, float res, float confidence, v_array<char> tag)
{
  if (f >= 0)
  {
    std::stringstream ss;
    char temp[30];
    sprintf(temp, "%f %f", res, confidence);
    ss << temp;
    if (!print_tag(ss, tag))
      ss << ' ';
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}